

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gym_Emu.cpp
# Opt level: O2

void get_gym_info(header_t *h,long length,track_info_t *out)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  if (*(int *)h->tag == 0x584d5947) {
    uVar2 = (length * 0x32) / 3;
    if ((ulong)*(uint *)h->loop_start == 0) {
      out->length = uVar2;
      lVar4 = 0;
    }
    else {
      uVar3 = ((ulong)*(uint *)h->loop_start * 0x32) / 3;
      lVar4 = uVar2 - uVar3;
      uVar2 = uVar3;
    }
    out->intro_length = uVar2;
    out->loop_length = lVar4;
    iVar1 = bcmp(h->song,"Unknown Song",0xd);
    if (iVar1 != 0) {
      Gme_File::copy_field_(out->song,h->song,0x20);
    }
    iVar1 = bcmp(h->game,"Unknown Game",0xd);
    if (iVar1 != 0) {
      Gme_File::copy_field_(out->game,h->game,0x20);
    }
    iVar1 = bcmp(h->copyright,"Unknown Publisher",0x12);
    if (iVar1 != 0) {
      Gme_File::copy_field_(out->copyright,h->copyright,0x20);
    }
    iVar1 = bcmp(h->dumper,"Unknown Person",0xf);
    if (iVar1 != 0) {
      Gme_File::copy_field_(out->dumper,h->dumper,0x20);
    }
    iVar1 = bcmp(h->comment,"Header added by YMAMP",0x16);
    if (iVar1 != 0) {
      Gme_File::copy_field_(out->comment,h->comment,0x100);
      return;
    }
  }
  return;
}

Assistant:

static void get_gym_info( Gym_Emu::header_t const& h, long length, track_info_t* out )
{
	if ( !memcmp( h.tag, "GYMX", 4 ) )
	{
		length = length * 50 / 3; // 1000 / 60
		long loop = get_le32( h.loop_start );
		if ( loop )
		{
			out->intro_length = loop * 50 / 3;
			out->loop_length  = length - out->intro_length;
		}
		else
		{
			out->length = length;
			out->intro_length = length; // make it clear that track is no longer than length
			out->loop_length = 0;
		}
		
		// more stupidity where the field should have been left
		if ( strcmp( h.song, "Unknown Song" ) )
			GME_COPY_FIELD( h, out, song );
		
		if ( strcmp( h.game, "Unknown Game" ) )
			GME_COPY_FIELD( h, out, game );
		
		if ( strcmp( h.copyright, "Unknown Publisher" ) )
			GME_COPY_FIELD( h, out, copyright );
		
		if ( strcmp( h.dumper, "Unknown Person" ) )
			GME_COPY_FIELD( h, out, dumper );
		
		if ( strcmp( h.comment, "Header added by YMAMP" ) )
			GME_COPY_FIELD( h, out, comment );
	}
}